

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_test_util.h
# Opt level: O1

void google::protobuf::MapTestUtil::ExpectMapFieldsSet<proto2_unittest::TestMap>(TestMap *message)

{
  anon_union_920_1_493b367e_for_TestMap_3 *this;
  MapField<proto2_unittest::TestMap_MapInt64Int64Entry_DoNotUse,_long,_long,_(google::protobuf::internal::WireFormatLite::FieldType)3,_(google::protobuf::internal::WireFormatLite::FieldType)3>
  *this_00;
  MapField<proto2_unittest::TestMap_MapUint32Uint32Entry_DoNotUse,_unsigned_int,_unsigned_int,_(google::protobuf::internal::WireFormatLite::FieldType)13,_(google::protobuf::internal::WireFormatLite::FieldType)13>
  *this_01;
  anon_union_32_1_898eb381_for_TypeDefinedMapFieldBase<int,_int>_3 *this_02;
  internal iVar1;
  int *piVar2;
  long *plVar3;
  uint *puVar4;
  unsigned_long *puVar5;
  float *pfVar6;
  double *pdVar7;
  bool *pbVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar9;
  MapEnum *pMVar10;
  ForeignMessage *pFVar11;
  anon_union_32_1_898eb381_for_TypeDefinedMapFieldBase<int,_proto2_unittest::ForeignMessage>_3
  *this_03;
  char *pcVar12;
  AssertionResult gtest_ar_30;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar_31;
  AssertHelper local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_170;
  undefined1 local_168 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_160;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_158;
  undefined1 local_148 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_140;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_138;
  key_arg<int> local_124;
  anon_union_32_1_898eb381_for_TypeDefinedMapFieldBase<int,_proto2_unittest::MapEnum>_3 *local_120;
  anon_union_32_1_898eb381_for_TypeDefinedMapFieldBase<bool,_bool>_3 *local_118;
  anon_union_32_1_898eb381_for_TypeDefinedMapFieldBase<int,_double>_3 *local_110;
  anon_union_32_1_898eb381_for_TypeDefinedMapFieldBase<int,_float>_3 *local_108;
  anon_union_32_1_898eb381_for_TypeDefinedMapFieldBase<long,_long>_3 *local_100;
  anon_union_32_1_898eb381_for_TypeDefinedMapFieldBase<int,_int>_3 *local_f8;
  anon_union_32_1_898eb381_for_TypeDefinedMapFieldBase<unsigned_long,_unsigned_long>_3 *local_f0;
  anon_union_32_1_898eb381_for_TypeDefinedMapFieldBase<unsigned_int,_unsigned_int>_3 *local_e8;
  anon_union_32_1_898eb381_for_TypeDefinedMapFieldBase<long,_long>_3 *local_e0;
  anon_union_32_1_898eb381_for_TypeDefinedMapFieldBase<int,_int>_3 *local_d8;
  anon_union_32_1_898eb381_for_TypeDefinedMapFieldBase<unsigned_long,_unsigned_long>_3 *local_d0;
  anon_union_32_1_898eb381_for_TypeDefinedMapFieldBase<unsigned_int,_unsigned_int>_3 *local_c8;
  anon_union_32_1_898eb381_for_TypeDefinedMapFieldBase<long,_long>_3 *local_c0;
  MapField<proto2_unittest::TestMap_MapInt32ForeignMessageEntry_DoNotUse,_int,_proto2_unittest::ForeignMessage,_(google::protobuf::internal::WireFormatLite::FieldType)5,_(google::protobuf::internal::WireFormatLite::FieldType)11>
  *local_b8;
  MapField<proto2_unittest::TestMap_MapInt32EnumEntry_DoNotUse,_int,_proto2_unittest::MapEnum,_(google::protobuf::internal::WireFormatLite::FieldType)5,_(google::protobuf::internal::WireFormatLite::FieldType)14>
  *local_b0;
  MapField<proto2_unittest::TestMap_MapInt32BytesEntry_DoNotUse,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)5,_(google::protobuf::internal::WireFormatLite::FieldType)12>
  *local_a8;
  MapField<proto2_unittest::TestMap_MapStringStringEntry_DoNotUse,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)9>
  *local_a0;
  MapField<proto2_unittest::TestMap_MapBoolBoolEntry_DoNotUse,_bool,_bool,_(google::protobuf::internal::WireFormatLite::FieldType)8,_(google::protobuf::internal::WireFormatLite::FieldType)8>
  *local_98;
  MapField<proto2_unittest::TestMap_MapInt32DoubleEntry_DoNotUse,_int,_double,_(google::protobuf::internal::WireFormatLite::FieldType)5,_(google::protobuf::internal::WireFormatLite::FieldType)1>
  *local_90;
  MapField<proto2_unittest::TestMap_MapInt32FloatEntry_DoNotUse,_int,_float,_(google::protobuf::internal::WireFormatLite::FieldType)5,_(google::protobuf::internal::WireFormatLite::FieldType)2>
  *local_88;
  MapField<proto2_unittest::TestMap_MapSfixed64Sfixed64Entry_DoNotUse,_long,_long,_(google::protobuf::internal::WireFormatLite::FieldType)16,_(google::protobuf::internal::WireFormatLite::FieldType)16>
  *local_80;
  MapField<proto2_unittest::TestMap_MapSfixed32Sfixed32Entry_DoNotUse,_int,_int,_(google::protobuf::internal::WireFormatLite::FieldType)15,_(google::protobuf::internal::WireFormatLite::FieldType)15>
  *local_78;
  MapField<proto2_unittest::TestMap_MapFixed64Fixed64Entry_DoNotUse,_unsigned_long,_unsigned_long,_(google::protobuf::internal::WireFormatLite::FieldType)6,_(google::protobuf::internal::WireFormatLite::FieldType)6>
  *local_70;
  MapField<proto2_unittest::TestMap_MapFixed32Fixed32Entry_DoNotUse,_unsigned_int,_unsigned_int,_(google::protobuf::internal::WireFormatLite::FieldType)7,_(google::protobuf::internal::WireFormatLite::FieldType)7>
  *local_68;
  MapField<proto2_unittest::TestMap_MapSint64Sint64Entry_DoNotUse,_long,_long,_(google::protobuf::internal::WireFormatLite::FieldType)18,_(google::protobuf::internal::WireFormatLite::FieldType)18>
  *local_60;
  MapField<proto2_unittest::TestMap_MapSint32Sint32Entry_DoNotUse,_int,_int,_(google::protobuf::internal::WireFormatLite::FieldType)17,_(google::protobuf::internal::WireFormatLite::FieldType)17>
  *local_58;
  MapField<proto2_unittest::TestMap_MapUint64Uint64Entry_DoNotUse,_unsigned_long,_unsigned_long,_(google::protobuf::internal::WireFormatLite::FieldType)4,_(google::protobuf::internal::WireFormatLite::FieldType)4>
  *local_50;
  anon_union_32_1_898eb381_for_TypeDefinedMapFieldBase<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_3
  *local_48;
  Map<std::__cxx11::string,std::__cxx11::string> *local_40;
  anon_union_32_1_898eb381_for_TypeDefinedMapFieldBase<int,_int>_3 *local_38;
  
  local_178.data_._0_4_ = 2;
  this = &message->field_0;
  protobuf::internal::MapFieldBase::SyncMapWithRepeatedField((MapFieldBase *)&this->_impl_);
  local_148._4_4_ = 0;
  local_148._0_4_ = *(uint *)((long)&message->field_0 + 0x10);
  testing::internal::CmpHelperEQ<int,unsigned_long>
            ((internal *)local_168,"2","message.map_int32_int32().size()",(int *)&local_178,
             (unsigned_long *)local_148);
  iVar1 = local_168[0];
  if (local_168[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_148);
    if (local_160 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar12 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar12 = (local_160->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_178,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map_test_util.h"
               ,0x107,pcVar12);
    testing::internal::AssertHelper::operator=(&local_178,(Message *)local_148);
    testing::internal::AssertHelper::~AssertHelper(&local_178);
    if (local_148 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_148 + 8))();
    }
  }
  if (local_160 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_160,local_160);
  }
  if (iVar1 != (internal)0x0) {
    local_178.data_._0_4_ = 2;
    this_00 = &(message->field_0)._impl_.map_int64_int64_;
    protobuf::internal::MapFieldBase::SyncMapWithRepeatedField((MapFieldBase *)this_00);
    local_148._4_4_ = 0;
    local_148._0_4_ = *(uint *)((long)&message->field_0 + 0x40);
    testing::internal::CmpHelperEQ<int,unsigned_long>
              ((internal *)local_168,"2","message.map_int64_int64().size()",(int *)&local_178,
               (unsigned_long *)local_148);
    iVar1 = local_168[0];
    if (local_168[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_148);
      if (local_160 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar12 = anon_var_dwarf_a12c75 + 5;
      }
      else {
        pcVar12 = (local_160->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_178,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map_test_util.h"
                 ,0x108,pcVar12);
      testing::internal::AssertHelper::operator=(&local_178,(Message *)local_148);
      testing::internal::AssertHelper::~AssertHelper(&local_178);
      if (local_148 != (undefined1  [8])0x0) {
        (**(code **)(*(long *)local_148 + 8))();
      }
    }
    if (local_160 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_160,local_160);
    }
    if (iVar1 != (internal)0x0) {
      local_178.data_._0_4_ = 2;
      this_01 = &(message->field_0)._impl_.map_uint32_uint32_;
      protobuf::internal::MapFieldBase::SyncMapWithRepeatedField((MapFieldBase *)this_01);
      local_148._4_4_ = 0;
      local_148._0_4_ = *(uint *)((long)&message->field_0 + 0x70);
      testing::internal::CmpHelperEQ<int,unsigned_long>
                ((internal *)local_168,"2","message.map_uint32_uint32().size()",(int *)&local_178,
                 (unsigned_long *)local_148);
      iVar1 = local_168[0];
      if (local_168[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_148);
        if (local_160 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar12 = anon_var_dwarf_a12c75 + 5;
        }
        else {
          pcVar12 = (local_160->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_178,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map_test_util.h"
                   ,0x109,pcVar12);
        testing::internal::AssertHelper::operator=(&local_178,(Message *)local_148);
        testing::internal::AssertHelper::~AssertHelper(&local_178);
        if (local_148 != (undefined1  [8])0x0) {
          (**(code **)(*(long *)local_148 + 8))();
        }
      }
      if (local_160 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_160,local_160);
      }
      if (iVar1 != (internal)0x0) {
        local_178.data_._0_4_ = 2;
        local_50 = &(message->field_0)._impl_.map_uint64_uint64_;
        protobuf::internal::MapFieldBase::SyncMapWithRepeatedField((MapFieldBase *)local_50);
        local_148._4_4_ = 0;
        local_148._0_4_ = *(uint *)((long)&message->field_0 + 0xa0);
        testing::internal::CmpHelperEQ<int,unsigned_long>
                  ((internal *)local_168,"2","message.map_uint64_uint64().size()",(int *)&local_178,
                   (unsigned_long *)local_148);
        iVar1 = local_168[0];
        if (local_168[0] == (internal)0x0) {
          testing::Message::Message((Message *)local_148);
          if (local_160 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar12 = anon_var_dwarf_a12c75 + 5;
          }
          else {
            pcVar12 = (local_160->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_178,kFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map_test_util.h"
                     ,0x10a,pcVar12);
          testing::internal::AssertHelper::operator=(&local_178,(Message *)local_148);
          testing::internal::AssertHelper::~AssertHelper(&local_178);
          if (local_148 != (undefined1  [8])0x0) {
            (**(code **)(*(long *)local_148 + 8))();
          }
        }
        if (local_160 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_160,local_160);
        }
        if (iVar1 != (internal)0x0) {
          local_178.data_._0_4_ = 2;
          local_58 = &(message->field_0)._impl_.map_sint32_sint32_;
          protobuf::internal::MapFieldBase::SyncMapWithRepeatedField((MapFieldBase *)local_58);
          local_148._4_4_ = 0;
          local_148._0_4_ = *(uint *)((long)&message->field_0 + 0xd0);
          testing::internal::CmpHelperEQ<int,unsigned_long>
                    ((internal *)local_168,"2","message.map_sint32_sint32().size()",
                     (int *)&local_178,(unsigned_long *)local_148);
          iVar1 = local_168[0];
          if (local_168[0] == (internal)0x0) {
            testing::Message::Message((Message *)local_148);
            if (local_160 ==
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              pcVar12 = anon_var_dwarf_a12c75 + 5;
            }
            else {
              pcVar12 = (local_160->_M_dataplus)._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_178,kFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map_test_util.h"
                       ,0x10b,pcVar12);
            testing::internal::AssertHelper::operator=(&local_178,(Message *)local_148);
            testing::internal::AssertHelper::~AssertHelper(&local_178);
            if (local_148 != (undefined1  [8])0x0) {
              (**(code **)(*(long *)local_148 + 8))();
            }
          }
          if (local_160 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&local_160,local_160);
          }
          if (iVar1 != (internal)0x0) {
            local_178.data_._0_4_ = 2;
            local_60 = &(message->field_0)._impl_.map_sint64_sint64_;
            protobuf::internal::MapFieldBase::SyncMapWithRepeatedField((MapFieldBase *)local_60);
            local_148._4_4_ = 0;
            local_148._0_4_ = *(uint *)((long)&message->field_0 + 0x100);
            testing::internal::CmpHelperEQ<int,unsigned_long>
                      ((internal *)local_168,"2","message.map_sint64_sint64().size()",
                       (int *)&local_178,(unsigned_long *)local_148);
            iVar1 = local_168[0];
            if (local_168[0] == (internal)0x0) {
              testing::Message::Message((Message *)local_148);
              if (local_160 ==
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar12 = anon_var_dwarf_a12c75 + 5;
              }
              else {
                pcVar12 = (local_160->_M_dataplus)._M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        (&local_178,kFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map_test_util.h"
                         ,0x10c,pcVar12);
              testing::internal::AssertHelper::operator=(&local_178,(Message *)local_148);
              testing::internal::AssertHelper::~AssertHelper(&local_178);
              if (local_148 != (undefined1  [8])0x0) {
                (**(code **)(*(long *)local_148 + 8))();
              }
            }
            if (local_160 !=
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&local_160,local_160);
            }
            if (iVar1 != (internal)0x0) {
              local_178.data_._0_4_ = 2;
              local_68 = &(message->field_0)._impl_.map_fixed32_fixed32_;
              protobuf::internal::MapFieldBase::SyncMapWithRepeatedField((MapFieldBase *)local_68);
              local_148._4_4_ = 0;
              local_148._0_4_ = *(uint *)((long)&message->field_0 + 0x130);
              testing::internal::CmpHelperEQ<int,unsigned_long>
                        ((internal *)local_168,"2","message.map_fixed32_fixed32().size()",
                         (int *)&local_178,(unsigned_long *)local_148);
              iVar1 = local_168[0];
              if (local_168[0] == (internal)0x0) {
                testing::Message::Message((Message *)local_148);
                if (local_160 ==
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  pcVar12 = anon_var_dwarf_a12c75 + 5;
                }
                else {
                  pcVar12 = (local_160->_M_dataplus)._M_p;
                }
                testing::internal::AssertHelper::AssertHelper
                          (&local_178,kFatalFailure,
                           "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map_test_util.h"
                           ,0x10d,pcVar12);
                testing::internal::AssertHelper::operator=(&local_178,(Message *)local_148);
                testing::internal::AssertHelper::~AssertHelper(&local_178);
                if (local_148 != (undefined1  [8])0x0) {
                  (**(code **)(*(long *)local_148 + 8))();
                }
              }
              if (local_160 !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                std::
                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&local_160,local_160);
              }
              if (iVar1 != (internal)0x0) {
                local_178.data_._0_4_ = 2;
                local_70 = &(message->field_0)._impl_.map_fixed64_fixed64_;
                protobuf::internal::MapFieldBase::SyncMapWithRepeatedField((MapFieldBase *)local_70)
                ;
                local_148._4_4_ = 0;
                local_148._0_4_ = *(uint *)((long)&message->field_0 + 0x160);
                testing::internal::CmpHelperEQ<int,unsigned_long>
                          ((internal *)local_168,"2","message.map_fixed64_fixed64().size()",
                           (int *)&local_178,(unsigned_long *)local_148);
                iVar1 = local_168[0];
                if (local_168[0] == (internal)0x0) {
                  testing::Message::Message((Message *)local_148);
                  if (local_160 ==
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                    pcVar12 = anon_var_dwarf_a12c75 + 5;
                  }
                  else {
                    pcVar12 = (local_160->_M_dataplus)._M_p;
                  }
                  testing::internal::AssertHelper::AssertHelper
                            (&local_178,kFatalFailure,
                             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map_test_util.h"
                             ,0x10e,pcVar12);
                  testing::internal::AssertHelper::operator=(&local_178,(Message *)local_148);
                  testing::internal::AssertHelper::~AssertHelper(&local_178);
                  if (local_148 != (undefined1  [8])0x0) {
                    (**(code **)(*(long *)local_148 + 8))();
                  }
                }
                if (local_160 !=
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  std::
                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)&local_160,local_160);
                }
                if (iVar1 != (internal)0x0) {
                  local_178.data_._0_4_ = 2;
                  local_78 = &(message->field_0)._impl_.map_sfixed32_sfixed32_;
                  protobuf::internal::MapFieldBase::SyncMapWithRepeatedField
                            ((MapFieldBase *)local_78);
                  local_148._4_4_ = 0;
                  local_148._0_4_ = *(uint *)((long)&message->field_0 + 400);
                  testing::internal::CmpHelperEQ<int,unsigned_long>
                            ((internal *)local_168,"2","message.map_sfixed32_sfixed32().size()",
                             (int *)&local_178,(unsigned_long *)local_148);
                  iVar1 = local_168[0];
                  if (local_168[0] == (internal)0x0) {
                    testing::Message::Message((Message *)local_148);
                    if (local_160 ==
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                      pcVar12 = anon_var_dwarf_a12c75 + 5;
                    }
                    else {
                      pcVar12 = (local_160->_M_dataplus)._M_p;
                    }
                    testing::internal::AssertHelper::AssertHelper
                              (&local_178,kFatalFailure,
                               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map_test_util.h"
                               ,0x10f,pcVar12);
                    testing::internal::AssertHelper::operator=(&local_178,(Message *)local_148);
                    testing::internal::AssertHelper::~AssertHelper(&local_178);
                    if (local_148 != (undefined1  [8])0x0) {
                      (**(code **)(*(long *)local_148 + 8))();
                    }
                  }
                  if (local_160 !=
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                    std::
                    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)&local_160,local_160);
                  }
                  if (iVar1 != (internal)0x0) {
                    local_178.data_._0_4_ = 2;
                    local_80 = &(message->field_0)._impl_.map_sfixed64_sfixed64_;
                    protobuf::internal::MapFieldBase::SyncMapWithRepeatedField
                              ((MapFieldBase *)local_80);
                    local_148._4_4_ = 0;
                    local_148._0_4_ = *(uint *)((long)&message->field_0 + 0x1c0);
                    testing::internal::CmpHelperEQ<int,unsigned_long>
                              ((internal *)local_168,"2","message.map_sfixed64_sfixed64().size()",
                               (int *)&local_178,(unsigned_long *)local_148);
                    iVar1 = local_168[0];
                    if (local_168[0] == (internal)0x0) {
                      testing::Message::Message((Message *)local_148);
                      if (local_160 ==
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
                      {
                        pcVar12 = anon_var_dwarf_a12c75 + 5;
                      }
                      else {
                        pcVar12 = (local_160->_M_dataplus)._M_p;
                      }
                      testing::internal::AssertHelper::AssertHelper
                                (&local_178,kFatalFailure,
                                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map_test_util.h"
                                 ,0x110,pcVar12);
                      testing::internal::AssertHelper::operator=(&local_178,(Message *)local_148);
                      testing::internal::AssertHelper::~AssertHelper(&local_178);
                      if (local_148 != (undefined1  [8])0x0) {
                        (**(code **)(*(long *)local_148 + 8))();
                      }
                    }
                    if (local_160 !=
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                      std::
                      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    *)&local_160,local_160);
                    }
                    if (iVar1 != (internal)0x0) {
                      local_178.data_._0_4_ = 2;
                      local_88 = &(message->field_0)._impl_.map_int32_float_;
                      protobuf::internal::MapFieldBase::SyncMapWithRepeatedField
                                ((MapFieldBase *)local_88);
                      local_148._4_4_ = 0;
                      local_148._0_4_ = *(uint *)((long)&message->field_0 + 0x1f0);
                      testing::internal::CmpHelperEQ<int,unsigned_long>
                                ((internal *)local_168,"2","message.map_int32_float().size()",
                                 (int *)&local_178,(unsigned_long *)local_148);
                      iVar1 = local_168[0];
                      if (local_168[0] == (internal)0x0) {
                        testing::Message::Message((Message *)local_148);
                        if (local_160 ==
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                           ) {
                          pcVar12 = anon_var_dwarf_a12c75 + 5;
                        }
                        else {
                          pcVar12 = (local_160->_M_dataplus)._M_p;
                        }
                        testing::internal::AssertHelper::AssertHelper
                                  (&local_178,kFatalFailure,
                                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map_test_util.h"
                                   ,0x111,pcVar12);
                        testing::internal::AssertHelper::operator=(&local_178,(Message *)local_148);
                        testing::internal::AssertHelper::~AssertHelper(&local_178);
                        if (local_148 != (undefined1  [8])0x0) {
                          (**(code **)(*(long *)local_148 + 8))();
                        }
                      }
                      if (local_160 !=
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
                      {
                        std::
                        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      *)&local_160,local_160);
                      }
                      if (iVar1 != (internal)0x0) {
                        local_178.data_._0_4_ = 2;
                        local_90 = &(message->field_0)._impl_.map_int32_double_;
                        protobuf::internal::MapFieldBase::SyncMapWithRepeatedField
                                  ((MapFieldBase *)local_90);
                        local_148._4_4_ = 0;
                        local_148._0_4_ = *(uint *)((long)&message->field_0 + 0x220);
                        testing::internal::CmpHelperEQ<int,unsigned_long>
                                  ((internal *)local_168,"2","message.map_int32_double().size()",
                                   (int *)&local_178,(unsigned_long *)local_148);
                        iVar1 = local_168[0];
                        if (local_168[0] == (internal)0x0) {
                          testing::Message::Message((Message *)local_148);
                          if (local_160 ==
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              0x0) {
                            pcVar12 = anon_var_dwarf_a12c75 + 5;
                          }
                          else {
                            pcVar12 = (local_160->_M_dataplus)._M_p;
                          }
                          testing::internal::AssertHelper::AssertHelper
                                    (&local_178,kFatalFailure,
                                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map_test_util.h"
                                     ,0x112,pcVar12);
                          testing::internal::AssertHelper::operator=
                                    (&local_178,(Message *)local_148);
                          testing::internal::AssertHelper::~AssertHelper(&local_178);
                          if (local_148 != (undefined1  [8])0x0) {
                            (**(code **)(*(long *)local_148 + 8))();
                          }
                        }
                        if (local_160 !=
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                           ) {
                          std::
                          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        *)&local_160,local_160);
                        }
                        if (iVar1 != (internal)0x0) {
                          local_178.data_._0_4_ = 2;
                          local_98 = &(message->field_0)._impl_.map_bool_bool_;
                          protobuf::internal::MapFieldBase::SyncMapWithRepeatedField
                                    ((MapFieldBase *)local_98);
                          local_148._4_4_ = 0;
                          local_148._0_4_ = *(uint *)((long)&message->field_0 + 0x250);
                          testing::internal::CmpHelperEQ<int,unsigned_long>
                                    ((internal *)local_168,"2","message.map_bool_bool().size()",
                                     (int *)&local_178,(unsigned_long *)local_148);
                          iVar1 = local_168[0];
                          if (local_168[0] == (internal)0x0) {
                            testing::Message::Message((Message *)local_148);
                            if (local_160 ==
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )0x0) {
                              pcVar12 = anon_var_dwarf_a12c75 + 5;
                            }
                            else {
                              pcVar12 = (local_160->_M_dataplus)._M_p;
                            }
                            testing::internal::AssertHelper::AssertHelper
                                      (&local_178,kFatalFailure,
                                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map_test_util.h"
                                       ,0x113,pcVar12);
                            testing::internal::AssertHelper::operator=
                                      (&local_178,(Message *)local_148);
                            testing::internal::AssertHelper::~AssertHelper(&local_178);
                            if (local_148 != (undefined1  [8])0x0) {
                              (**(code **)(*(long *)local_148 + 8))();
                            }
                          }
                          if (local_160 !=
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              0x0) {
                            std::
                            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                          *)&local_160,local_160);
                          }
                          if (iVar1 != (internal)0x0) {
                            local_178.data_._0_4_ = 2;
                            local_a0 = &(message->field_0)._impl_.map_string_string_;
                            protobuf::internal::MapFieldBase::SyncMapWithRepeatedField
                                      ((MapFieldBase *)local_a0);
                            local_148._4_4_ = 0;
                            local_148._0_4_ = *(uint *)((long)&message->field_0 + 0x280);
                            testing::internal::CmpHelperEQ<int,unsigned_long>
                                      ((internal *)local_168,"2",
                                       "message.map_string_string().size()",(int *)&local_178,
                                       (unsigned_long *)local_148);
                            iVar1 = local_168[0];
                            if (local_168[0] == (internal)0x0) {
                              testing::Message::Message((Message *)local_148);
                              if (local_160 ==
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)0x0) {
                                pcVar12 = anon_var_dwarf_a12c75 + 5;
                              }
                              else {
                                pcVar12 = (local_160->_M_dataplus)._M_p;
                              }
                              testing::internal::AssertHelper::AssertHelper
                                        (&local_178,kFatalFailure,
                                         "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map_test_util.h"
                                         ,0x114,pcVar12);
                              testing::internal::AssertHelper::operator=
                                        (&local_178,(Message *)local_148);
                              testing::internal::AssertHelper::~AssertHelper(&local_178);
                              if (local_148 != (undefined1  [8])0x0) {
                                (**(code **)(*(long *)local_148 + 8))();
                              }
                            }
                            if (local_160 !=
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )0x0) {
                              std::
                              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                            *)&local_160,local_160);
                            }
                            if (iVar1 != (internal)0x0) {
                              local_178.data_._0_4_ = 2;
                              local_a8 = &(message->field_0)._impl_.map_int32_bytes_;
                              protobuf::internal::MapFieldBase::SyncMapWithRepeatedField
                                        ((MapFieldBase *)local_a8);
                              local_148._4_4_ = 0;
                              local_148._0_4_ = *(uint *)((long)&message->field_0 + 0x2b0);
                              testing::internal::CmpHelperEQ<int,unsigned_long>
                                        ((internal *)local_168,"2",
                                         "message.map_int32_bytes().size()",(int *)&local_178,
                                         (unsigned_long *)local_148);
                              iVar1 = local_168[0];
                              if (local_168[0] == (internal)0x0) {
                                testing::Message::Message((Message *)local_148);
                                if (local_160 ==
                                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0) {
                                  pcVar12 = anon_var_dwarf_a12c75 + 5;
                                }
                                else {
                                  pcVar12 = (local_160->_M_dataplus)._M_p;
                                }
                                testing::internal::AssertHelper::AssertHelper
                                          (&local_178,kFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map_test_util.h"
                                           ,0x115,pcVar12);
                                testing::internal::AssertHelper::operator=
                                          (&local_178,(Message *)local_148);
                                testing::internal::AssertHelper::~AssertHelper(&local_178);
                                if (local_148 != (undefined1  [8])0x0) {
                                  (**(code **)(*(long *)local_148 + 8))();
                                }
                              }
                              if (local_160 !=
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)0x0) {
                                std::
                                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                              *)&local_160,local_160);
                              }
                              if (iVar1 != (internal)0x0) {
                                local_178.data_._0_4_ = 2;
                                local_b0 = &(message->field_0)._impl_.map_int32_enum_;
                                protobuf::internal::MapFieldBase::SyncMapWithRepeatedField
                                          ((MapFieldBase *)local_b0);
                                local_148._4_4_ = 0;
                                local_148._0_4_ = *(uint *)((long)&message->field_0 + 0x2e0);
                                testing::internal::CmpHelperEQ<int,unsigned_long>
                                          ((internal *)local_168,"2",
                                           "message.map_int32_enum().size()",(int *)&local_178,
                                           (unsigned_long *)local_148);
                                iVar1 = local_168[0];
                                if (local_168[0] == (internal)0x0) {
                                  testing::Message::Message((Message *)local_148);
                                  if (local_160 ==
                                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)0x0) {
                                    pcVar12 = anon_var_dwarf_a12c75 + 5;
                                  }
                                  else {
                                    pcVar12 = (local_160->_M_dataplus)._M_p;
                                  }
                                  testing::internal::AssertHelper::AssertHelper
                                            (&local_178,kFatalFailure,
                                             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map_test_util.h"
                                             ,0x116,pcVar12);
                                  testing::internal::AssertHelper::operator=
                                            (&local_178,(Message *)local_148);
                                  testing::internal::AssertHelper::~AssertHelper(&local_178);
                                  if (local_148 != (undefined1  [8])0x0) {
                                    (**(code **)(*(long *)local_148 + 8))();
                                  }
                                }
                                if (local_160 !=
                                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0) {
                                  std::
                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                *)&local_160,local_160);
                                }
                                if (iVar1 != (internal)0x0) {
                                  local_178.data_._0_4_ = 2;
                                  local_b8 = &(message->field_0)._impl_.map_int32_foreign_message_;
                                  protobuf::internal::MapFieldBase::SyncMapWithRepeatedField
                                            ((MapFieldBase *)local_b8);
                                  local_148._4_4_ = 0;
                                  local_148._0_4_ = *(uint *)((long)&message->field_0 + 0x310);
                                  testing::internal::CmpHelperEQ<int,unsigned_long>
                                            ((internal *)local_168,"2",
                                             "message.map_int32_foreign_message().size()",
                                             (int *)&local_178,(unsigned_long *)local_148);
                                  iVar1 = local_168[0];
                                  if (local_168[0] == (internal)0x0) {
                                    testing::Message::Message((Message *)local_148);
                                    if (local_160 ==
                                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)0x0) {
                                      pcVar12 = anon_var_dwarf_a12c75 + 5;
                                    }
                                    else {
                                      pcVar12 = (local_160->_M_dataplus)._M_p;
                                    }
                                    testing::internal::AssertHelper::AssertHelper
                                              (&local_178,kFatalFailure,
                                               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map_test_util.h"
                                               ,0x117,pcVar12);
                                    testing::internal::AssertHelper::operator=
                                              (&local_178,(Message *)local_148);
                                    testing::internal::AssertHelper::~AssertHelper(&local_178);
                                    if (local_148 != (undefined1  [8])0x0) {
                                      (**(code **)(*(long *)local_148 + 8))();
                                    }
                                  }
                                  if (local_160 !=
                                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)0x0) {
                                    std::
                                    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_160,local_160);
                                  }
                                  if (iVar1 != (internal)0x0) {
                                    this_02 = &(message->field_0)._impl_.map_int32_int32_.
                                               super_TypeDefinedMapFieldBase<int,_int>.field_0;
                                    local_148 = (undefined1  [8])
                                                ((ulong)local_148 & 0xffffffff00000000);
                                    protobuf::internal::MapFieldBase::SyncMapWithRepeatedField
                                              ((MapFieldBase *)&this->_impl_);
                                    local_178.data_._0_4_ = 0;
                                    local_38 = this_02;
                                    piVar2 = Map<int,_int>::at<int>
                                                       (&this_02->map_,(key_arg<int> *)&local_178);
                                    testing::internal::CmpHelperEQ<int,int>
                                              ((internal *)local_168,"0",
                                               "message.map_int32_int32().at(0)",(int *)local_148,
                                               piVar2);
                                    if (local_168[0] == (internal)0x0) {
                                      testing::Message::Message((Message *)local_148);
                                      if (local_160 ==
                                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)0x0) {
                                        pcVar12 = anon_var_dwarf_a12c75 + 5;
                                      }
                                      else {
                                        pcVar12 = (local_160->_M_dataplus)._M_p;
                                      }
                                      testing::internal::AssertHelper::AssertHelper
                                                (&local_178,kNonFatalFailure,
                                                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map_test_util.h"
                                                 ,0x119,pcVar12);
                                      testing::internal::AssertHelper::operator=
                                                (&local_178,(Message *)local_148);
                                      testing::internal::AssertHelper::~AssertHelper(&local_178);
                                      if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                                           )local_148 !=
                                          (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           )0x0) {
                                        (**(code **)(*(long *)local_148 + 8))();
                                      }
                                    }
                                    local_c0 = &(message->field_0)._impl_.map_int64_int64_.
                                                super_TypeDefinedMapFieldBase<long,_long>.field_0;
                                    if (local_160 !=
                                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)0x0) {
                                      std::
                                      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_160,local_160);
                                    }
                                    local_178.data_._0_4_ = 0;
                                    protobuf::internal::MapFieldBase::SyncMapWithRepeatedField
                                              ((MapFieldBase *)this_00);
                                    local_148 = (undefined1  [8])0x0;
                                    plVar3 = Map<long,_long>::at<long>
                                                       (&local_c0->map_,(key_arg<long> *)local_148);
                                    testing::internal::CmpHelperEQ<int,long>
                                              ((internal *)local_168,"0",
                                               "message.map_int64_int64().at(0)",(int *)&local_178,
                                               plVar3);
                                    if (local_168[0] == (internal)0x0) {
                                      testing::Message::Message((Message *)local_148);
                                      if (local_160 ==
                                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)0x0) {
                                        pcVar12 = anon_var_dwarf_a12c75 + 5;
                                      }
                                      else {
                                        pcVar12 = (local_160->_M_dataplus)._M_p;
                                      }
                                      testing::internal::AssertHelper::AssertHelper
                                                (&local_178,kNonFatalFailure,
                                                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map_test_util.h"
                                                 ,0x11a,pcVar12);
                                      testing::internal::AssertHelper::operator=
                                                (&local_178,(Message *)local_148);
                                      testing::internal::AssertHelper::~AssertHelper(&local_178);
                                      if (local_148 != (undefined1  [8])0x0) {
                                        (**(code **)(*(long *)local_148 + 8))();
                                      }
                                    }
                                    local_c8 = &(message->field_0)._impl_.map_uint32_uint32_.
                                                super_TypeDefinedMapFieldBase<unsigned_int,_unsigned_int>
                                                .field_0;
                                    if (local_160 !=
                                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)0x0) {
                                      std::
                                      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_160,local_160);
                                    }
                                    local_148 = (undefined1  [8])
                                                ((ulong)local_148 & 0xffffffff00000000);
                                    protobuf::internal::MapFieldBase::SyncMapWithRepeatedField
                                              ((MapFieldBase *)this_01);
                                    local_178.data_._0_4_ = 0;
                                    puVar4 = Map<unsigned_int,_unsigned_int>::at<unsigned_int>
                                                       (&local_c8->map_,
                                                        (key_arg<unsigned_int> *)&local_178);
                                    testing::internal::CmpHelperEQ<int,unsigned_int>
                                              ((internal *)local_168,"0",
                                               "message.map_uint32_uint32().at(0)",(int *)local_148,
                                               puVar4);
                                    if (local_168[0] == (internal)0x0) {
                                      testing::Message::Message((Message *)local_148);
                                      if (local_160 ==
                                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)0x0) {
                                        pcVar12 = anon_var_dwarf_a12c75 + 5;
                                      }
                                      else {
                                        pcVar12 = (local_160->_M_dataplus)._M_p;
                                      }
                                      testing::internal::AssertHelper::AssertHelper
                                                (&local_178,kNonFatalFailure,
                                                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map_test_util.h"
                                                 ,0x11b,pcVar12);
                                      testing::internal::AssertHelper::operator=
                                                (&local_178,(Message *)local_148);
                                      testing::internal::AssertHelper::~AssertHelper(&local_178);
                                      if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                                           )local_148 !=
                                          (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           )0x0) {
                                        (**(code **)(*(long *)local_148 + 8))();
                                      }
                                    }
                                    local_d0 = &(message->field_0)._impl_.map_uint64_uint64_.
                                                super_TypeDefinedMapFieldBase<unsigned_long,_unsigned_long>
                                                .field_0;
                                    if (local_160 !=
                                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)0x0) {
                                      std::
                                      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_160,local_160);
                                    }
                                    local_178.data_._0_4_ = 0;
                                    protobuf::internal::MapFieldBase::SyncMapWithRepeatedField
                                              ((MapFieldBase *)local_50);
                                    local_148 = (undefined1  [8])0x0;
                                    puVar5 = Map<unsigned_long,_unsigned_long>::at<unsigned_long>
                                                       (&local_d0->map_,
                                                        (key_arg<unsigned_long> *)local_148);
                                    testing::internal::CmpHelperEQ<int,unsigned_long>
                                              ((internal *)local_168,"0",
                                               "message.map_uint64_uint64().at(0)",(int *)&local_178
                                               ,puVar5);
                                    if (local_168[0] == (internal)0x0) {
                                      testing::Message::Message((Message *)local_148);
                                      if (local_160 ==
                                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)0x0) {
                                        pcVar12 = anon_var_dwarf_a12c75 + 5;
                                      }
                                      else {
                                        pcVar12 = (local_160->_M_dataplus)._M_p;
                                      }
                                      testing::internal::AssertHelper::AssertHelper
                                                (&local_178,kNonFatalFailure,
                                                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map_test_util.h"
                                                 ,0x11c,pcVar12);
                                      testing::internal::AssertHelper::operator=
                                                (&local_178,(Message *)local_148);
                                      testing::internal::AssertHelper::~AssertHelper(&local_178);
                                      if (local_148 != (undefined1  [8])0x0) {
                                        (**(code **)(*(long *)local_148 + 8))();
                                      }
                                    }
                                    local_d8 = &(message->field_0)._impl_.map_sint32_sint32_.
                                                super_TypeDefinedMapFieldBase<int,_int>.field_0;
                                    if (local_160 !=
                                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)0x0) {
                                      std::
                                      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_160,local_160);
                                    }
                                    local_148 = (undefined1  [8])
                                                ((ulong)local_148 & 0xffffffff00000000);
                                    protobuf::internal::MapFieldBase::SyncMapWithRepeatedField
                                              ((MapFieldBase *)local_58);
                                    local_178.data_._0_4_ = 0;
                                    piVar2 = Map<int,_int>::at<int>
                                                       (&local_d8->map_,(key_arg<int> *)&local_178);
                                    testing::internal::CmpHelperEQ<int,int>
                                              ((internal *)local_168,"0",
                                               "message.map_sint32_sint32().at(0)",(int *)local_148,
                                               piVar2);
                                    if (local_168[0] == (internal)0x0) {
                                      testing::Message::Message((Message *)local_148);
                                      if (local_160 ==
                                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)0x0) {
                                        pcVar12 = anon_var_dwarf_a12c75 + 5;
                                      }
                                      else {
                                        pcVar12 = (local_160->_M_dataplus)._M_p;
                                      }
                                      testing::internal::AssertHelper::AssertHelper
                                                (&local_178,kNonFatalFailure,
                                                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map_test_util.h"
                                                 ,0x11d,pcVar12);
                                      testing::internal::AssertHelper::operator=
                                                (&local_178,(Message *)local_148);
                                      testing::internal::AssertHelper::~AssertHelper(&local_178);
                                      if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                                           )local_148 !=
                                          (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           )0x0) {
                                        (**(code **)(*(long *)local_148 + 8))();
                                      }
                                    }
                                    local_e0 = &(message->field_0)._impl_.map_sint64_sint64_.
                                                super_TypeDefinedMapFieldBase<long,_long>.field_0;
                                    if (local_160 !=
                                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)0x0) {
                                      std::
                                      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_160,local_160);
                                    }
                                    local_178.data_._0_4_ = 0;
                                    protobuf::internal::MapFieldBase::SyncMapWithRepeatedField
                                              ((MapFieldBase *)local_60);
                                    local_148 = (undefined1  [8])0x0;
                                    plVar3 = Map<long,_long>::at<long>
                                                       (&local_e0->map_,(key_arg<long> *)local_148);
                                    testing::internal::CmpHelperEQ<int,long>
                                              ((internal *)local_168,"0",
                                               "message.map_sint64_sint64().at(0)",(int *)&local_178
                                               ,plVar3);
                                    if (local_168[0] == (internal)0x0) {
                                      testing::Message::Message((Message *)local_148);
                                      if (local_160 ==
                                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)0x0) {
                                        pcVar12 = anon_var_dwarf_a12c75 + 5;
                                      }
                                      else {
                                        pcVar12 = (local_160->_M_dataplus)._M_p;
                                      }
                                      testing::internal::AssertHelper::AssertHelper
                                                (&local_178,kNonFatalFailure,
                                                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map_test_util.h"
                                                 ,0x11e,pcVar12);
                                      testing::internal::AssertHelper::operator=
                                                (&local_178,(Message *)local_148);
                                      testing::internal::AssertHelper::~AssertHelper(&local_178);
                                      if (local_148 != (undefined1  [8])0x0) {
                                        (**(code **)(*(long *)local_148 + 8))();
                                      }
                                    }
                                    local_e8 = &(message->field_0)._impl_.map_fixed32_fixed32_.
                                                super_TypeDefinedMapFieldBase<unsigned_int,_unsigned_int>
                                                .field_0;
                                    if (local_160 !=
                                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)0x0) {
                                      std::
                                      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_160,local_160);
                                    }
                                    local_148 = (undefined1  [8])
                                                ((ulong)local_148 & 0xffffffff00000000);
                                    protobuf::internal::MapFieldBase::SyncMapWithRepeatedField
                                              ((MapFieldBase *)local_68);
                                    local_178.data_._0_4_ = 0;
                                    puVar4 = Map<unsigned_int,_unsigned_int>::at<unsigned_int>
                                                       (&local_e8->map_,
                                                        (key_arg<unsigned_int> *)&local_178);
                                    testing::internal::CmpHelperEQ<int,unsigned_int>
                                              ((internal *)local_168,"0",
                                               "message.map_fixed32_fixed32().at(0)",
                                               (int *)local_148,puVar4);
                                    if (local_168[0] == (internal)0x0) {
                                      testing::Message::Message((Message *)local_148);
                                      if (local_160 ==
                                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)0x0) {
                                        pcVar12 = anon_var_dwarf_a12c75 + 5;
                                      }
                                      else {
                                        pcVar12 = (local_160->_M_dataplus)._M_p;
                                      }
                                      testing::internal::AssertHelper::AssertHelper
                                                (&local_178,kNonFatalFailure,
                                                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map_test_util.h"
                                                 ,0x11f,pcVar12);
                                      testing::internal::AssertHelper::operator=
                                                (&local_178,(Message *)local_148);
                                      testing::internal::AssertHelper::~AssertHelper(&local_178);
                                      if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                                           )local_148 !=
                                          (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           )0x0) {
                                        (**(code **)(*(long *)local_148 + 8))();
                                      }
                                    }
                                    local_f0 = &(message->field_0)._impl_.map_fixed64_fixed64_.
                                                super_TypeDefinedMapFieldBase<unsigned_long,_unsigned_long>
                                                .field_0;
                                    if (local_160 !=
                                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)0x0) {
                                      std::
                                      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_160,local_160);
                                    }
                                    local_178.data_._0_4_ = 0;
                                    protobuf::internal::MapFieldBase::SyncMapWithRepeatedField
                                              ((MapFieldBase *)local_70);
                                    local_148 = (undefined1  [8])0x0;
                                    puVar5 = Map<unsigned_long,_unsigned_long>::at<unsigned_long>
                                                       (&local_f0->map_,
                                                        (key_arg<unsigned_long> *)local_148);
                                    testing::internal::CmpHelperEQ<int,unsigned_long>
                                              ((internal *)local_168,"0",
                                               "message.map_fixed64_fixed64().at(0)",
                                               (int *)&local_178,puVar5);
                                    if (local_168[0] == (internal)0x0) {
                                      testing::Message::Message((Message *)local_148);
                                      if (local_160 ==
                                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)0x0) {
                                        pcVar12 = anon_var_dwarf_a12c75 + 5;
                                      }
                                      else {
                                        pcVar12 = (local_160->_M_dataplus)._M_p;
                                      }
                                      testing::internal::AssertHelper::AssertHelper
                                                (&local_178,kNonFatalFailure,
                                                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map_test_util.h"
                                                 ,0x120,pcVar12);
                                      testing::internal::AssertHelper::operator=
                                                (&local_178,(Message *)local_148);
                                      testing::internal::AssertHelper::~AssertHelper(&local_178);
                                      if (local_148 != (undefined1  [8])0x0) {
                                        (**(code **)(*(long *)local_148 + 8))();
                                      }
                                    }
                                    local_f8 = &(message->field_0)._impl_.map_sfixed32_sfixed32_.
                                                super_TypeDefinedMapFieldBase<int,_int>.field_0;
                                    if (local_160 !=
                                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)0x0) {
                                      std::
                                      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_160,local_160);
                                    }
                                    local_148 = (undefined1  [8])
                                                ((ulong)local_148 & 0xffffffff00000000);
                                    protobuf::internal::MapFieldBase::SyncMapWithRepeatedField
                                              ((MapFieldBase *)local_78);
                                    local_178.data_._0_4_ = 0;
                                    piVar2 = Map<int,_int>::at<int>
                                                       (&local_f8->map_,(key_arg<int> *)&local_178);
                                    testing::internal::CmpHelperEQ<int,int>
                                              ((internal *)local_168,"0",
                                               "message.map_sfixed32_sfixed32().at(0)",
                                               (int *)local_148,piVar2);
                                    if (local_168[0] == (internal)0x0) {
                                      testing::Message::Message((Message *)local_148);
                                      if (local_160 ==
                                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)0x0) {
                                        pcVar12 = anon_var_dwarf_a12c75 + 5;
                                      }
                                      else {
                                        pcVar12 = (local_160->_M_dataplus)._M_p;
                                      }
                                      testing::internal::AssertHelper::AssertHelper
                                                (&local_178,kNonFatalFailure,
                                                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map_test_util.h"
                                                 ,0x121,pcVar12);
                                      testing::internal::AssertHelper::operator=
                                                (&local_178,(Message *)local_148);
                                      testing::internal::AssertHelper::~AssertHelper(&local_178);
                                      if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                                           )local_148 !=
                                          (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           )0x0) {
                                        (**(code **)(*(long *)local_148 + 8))();
                                      }
                                    }
                                    local_100 = &(message->field_0)._impl_.map_sfixed64_sfixed64_.
                                                 super_TypeDefinedMapFieldBase<long,_long>.field_0;
                                    if (local_160 !=
                                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)0x0) {
                                      std::
                                      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_160,local_160);
                                    }
                                    local_178.data_._0_4_ = 0;
                                    protobuf::internal::MapFieldBase::SyncMapWithRepeatedField
                                              ((MapFieldBase *)local_80);
                                    local_148 = (undefined1  [8])0x0;
                                    plVar3 = Map<long,_long>::at<long>
                                                       (&local_100->map_,(key_arg<long> *)local_148)
                                    ;
                                    testing::internal::CmpHelperEQ<int,long>
                                              ((internal *)local_168,"0",
                                               "message.map_sfixed64_sfixed64().at(0)",
                                               (int *)&local_178,plVar3);
                                    if (local_168[0] == (internal)0x0) {
                                      testing::Message::Message((Message *)local_148);
                                      if (local_160 ==
                                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)0x0) {
                                        pcVar12 = anon_var_dwarf_a12c75 + 5;
                                      }
                                      else {
                                        pcVar12 = (local_160->_M_dataplus)._M_p;
                                      }
                                      testing::internal::AssertHelper::AssertHelper
                                                (&local_178,kNonFatalFailure,
                                                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map_test_util.h"
                                                 ,0x122,pcVar12);
                                      testing::internal::AssertHelper::operator=
                                                (&local_178,(Message *)local_148);
                                      testing::internal::AssertHelper::~AssertHelper(&local_178);
                                      if (local_148 != (undefined1  [8])0x0) {
                                        (**(code **)(*(long *)local_148 + 8))();
                                      }
                                    }
                                    local_108 = &(message->field_0)._impl_.map_int32_float_.
                                                 super_TypeDefinedMapFieldBase<int,_float>.field_0;
                                    if (local_160 !=
                                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)0x0) {
                                      std::
                                      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_160,local_160);
                                    }
                                    local_148 = (undefined1  [8])
                                                ((ulong)local_148 & 0xffffffff00000000);
                                    protobuf::internal::MapFieldBase::SyncMapWithRepeatedField
                                              ((MapFieldBase *)local_88);
                                    local_178.data_._0_4_ = 0;
                                    pfVar6 = Map<int,_float>::at<int>
                                                       (&local_108->map_,(key_arg<int> *)&local_178)
                                    ;
                                    testing::internal::CmpHelperEQ<int,float>
                                              ((internal *)local_168,"0",
                                               "message.map_int32_float().at(0)",(int *)local_148,
                                               pfVar6);
                                    if (local_168[0] == (internal)0x0) {
                                      testing::Message::Message((Message *)local_148);
                                      if (local_160 ==
                                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)0x0) {
                                        pcVar12 = anon_var_dwarf_a12c75 + 5;
                                      }
                                      else {
                                        pcVar12 = (local_160->_M_dataplus)._M_p;
                                      }
                                      testing::internal::AssertHelper::AssertHelper
                                                (&local_178,kNonFatalFailure,
                                                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map_test_util.h"
                                                 ,0x123,pcVar12);
                                      testing::internal::AssertHelper::operator=
                                                (&local_178,(Message *)local_148);
                                      testing::internal::AssertHelper::~AssertHelper(&local_178);
                                      if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                                           )local_148 !=
                                          (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           )0x0) {
                                        (**(code **)(*(long *)local_148 + 8))();
                                      }
                                    }
                                    local_110 = &(message->field_0)._impl_.map_int32_double_.
                                                 super_TypeDefinedMapFieldBase<int,_double>.field_0;
                                    if (local_160 !=
                                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)0x0) {
                                      std::
                                      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_160,local_160);
                                    }
                                    local_148 = (undefined1  [8])
                                                ((ulong)local_148 & 0xffffffff00000000);
                                    protobuf::internal::MapFieldBase::SyncMapWithRepeatedField
                                              ((MapFieldBase *)local_90);
                                    local_178.data_._0_4_ = 0;
                                    pdVar7 = Map<int,_double>::at<int>
                                                       (&local_110->map_,(key_arg<int> *)&local_178)
                                    ;
                                    testing::internal::CmpHelperEQ<int,double>
                                              ((internal *)local_168,"0",
                                               "message.map_int32_double().at(0)",(int *)local_148,
                                               pdVar7);
                                    if (local_168[0] == (internal)0x0) {
                                      testing::Message::Message((Message *)local_148);
                                      if (local_160 ==
                                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)0x0) {
                                        pcVar12 = anon_var_dwarf_a12c75 + 5;
                                      }
                                      else {
                                        pcVar12 = (local_160->_M_dataplus)._M_p;
                                      }
                                      testing::internal::AssertHelper::AssertHelper
                                                (&local_178,kNonFatalFailure,
                                                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map_test_util.h"
                                                 ,0x124,pcVar12);
                                      testing::internal::AssertHelper::operator=
                                                (&local_178,(Message *)local_148);
                                      testing::internal::AssertHelper::~AssertHelper(&local_178);
                                      if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                                           )local_148 !=
                                          (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           )0x0) {
                                        (**(code **)(*(long *)local_148 + 8))();
                                      }
                                    }
                                    local_118 = &(message->field_0)._impl_.map_bool_bool_.
                                                 super_TypeDefinedMapFieldBase<bool,_bool>.field_0;
                                    if (local_160 !=
                                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)0x0) {
                                      std::
                                      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_160,local_160);
                                    }
                                    local_148 = (undefined1  [8])
                                                ((ulong)local_148 & 0xffffffffffffff00);
                                    protobuf::internal::MapFieldBase::SyncMapWithRepeatedField
                                              ((MapFieldBase *)local_98);
                                    local_178.data_._0_4_ = (uint)local_178.data_ & 0xffffff00;
                                    pbVar8 = Map<bool,_bool>::at<bool>
                                                       (&local_118->map_,(key_arg<bool> *)&local_178
                                                       );
                                    testing::internal::CmpHelperEQ<bool,bool>
                                              ((internal *)local_168,"false",
                                               "message.map_bool_bool().at(0)",(bool *)local_148,
                                               pbVar8);
                                    if (local_168[0] == (internal)0x0) {
                                      testing::Message::Message((Message *)local_148);
                                      if (local_160 ==
                                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)0x0) {
                                        pcVar12 = anon_var_dwarf_a12c75 + 5;
                                      }
                                      else {
                                        pcVar12 = (local_160->_M_dataplus)._M_p;
                                      }
                                      testing::internal::AssertHelper::AssertHelper
                                                (&local_178,kNonFatalFailure,
                                                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map_test_util.h"
                                                 ,0x125,pcVar12);
                                      testing::internal::AssertHelper::operator=
                                                (&local_178,(Message *)local_148);
                                      testing::internal::AssertHelper::~AssertHelper(&local_178);
                                      if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                                           )local_148 !=
                                          (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           )0x0) {
                                        (**(code **)(*(long *)local_148 + 8))();
                                      }
                                    }
                                    if (local_160 !=
                                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)0x0) {
                                      std::
                                      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_160,local_160);
                                    }
                                    local_168 = (undefined1  [8])&local_158;
                                    std::__cxx11::string::_M_construct<char_const*>
                                              ((string *)local_168,
                                               "This is a very long string that goes in the heap",""
                                              );
                                    protobuf::internal::MapFieldBase::SyncMapWithRepeatedField
                                              ((MapFieldBase *)local_a0);
                                    local_148 = (undefined1  [8])&local_138;
                                    std::__cxx11::string::_M_construct<char_const*>
                                              ((string *)local_148,
                                               "This is a very long string that goes in the heap",""
                                              );
                                    local_40 = (Map<std::__cxx11::string,std::__cxx11::string> *)
                                               &(message->field_0)._impl_.map_string_string_.
                                                super_TypeDefinedMapFieldBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                .field_0;
                                    pbVar9 = Map<std::__cxx11::string,std::__cxx11::string>::
                                             at<std::__cxx11::string>
                                                       (local_40,(
                                                  key_arg<std::__cxx11::basic_string<char>_> *)
                                                  local_148);
                                    testing::internal::
                                    CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
                                              ((internal *)&local_178,"long_string()",
                                               "message.map_string_string().at(long_string())",
                                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                *)local_168,pbVar9);
                                    if (local_148 != (undefined1  [8])&local_138) {
                                      operator_delete((void *)local_148,
                                                      local_138._M_allocated_capacity + 1);
                                    }
                                    if (local_168 != (undefined1  [8])&local_158) {
                                      operator_delete((void *)local_168,
                                                      local_158._M_allocated_capacity + 1);
                                    }
                                    if (local_178.data_._0_1_ == (internal)0x0) {
                                      testing::Message::Message((Message *)local_168);
                                      if (local_170 ==
                                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)0x0) {
                                        pcVar12 = anon_var_dwarf_a12c75 + 5;
                                      }
                                      else {
                                        pcVar12 = (local_170->_M_dataplus)._M_p;
                                      }
                                      testing::internal::AssertHelper::AssertHelper
                                                ((AssertHelper *)local_148,kNonFatalFailure,
                                                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map_test_util.h"
                                                 ,0x126,pcVar12);
                                      testing::internal::AssertHelper::operator=
                                                ((AssertHelper *)local_148,(Message *)local_168);
                                      testing::internal::AssertHelper::~AssertHelper
                                                ((AssertHelper *)local_148);
                                      if (local_168 != (undefined1  [8])0x0) {
                                        (**(code **)(*(size_type *)local_168 + 8))();
                                      }
                                    }
                                    if (local_170 !=
                                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)0x0) {
                                      std::
                                      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_170,local_170);
                                    }
                                    local_168 = (undefined1  [8])&local_158;
                                    std::__cxx11::string::_M_construct<char_const*>
                                              ((string *)local_168,
                                               "This is a very long string that goes in the heap",""
                                              );
                                    protobuf::internal::MapFieldBase::SyncMapWithRepeatedField
                                              ((MapFieldBase *)local_a8);
                                    local_48 = &(message->field_0)._impl_.map_int32_bytes_.
                                                super_TypeDefinedMapFieldBase<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                .field_0;
                                    local_178.data_._0_4_ = 0;
                                    pbVar9 = Map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                             ::at<int>(&local_48->map_,(key_arg<int> *)&local_178);
                                    testing::internal::
                                    CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
                                              ((internal *)local_148,"long_string()",
                                               "message.map_int32_bytes().at(0)",
                                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                *)local_168,pbVar9);
                                    if (local_168 != (undefined1  [8])&local_158) {
                                      operator_delete((void *)local_168,
                                                      local_158._M_allocated_capacity + 1);
                                    }
                                    if (local_148[0] == (string)0x0) {
                                      testing::Message::Message((Message *)local_168);
                                      if (local_140 ==
                                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)0x0) {
                                        pcVar12 = anon_var_dwarf_a12c75 + 5;
                                      }
                                      else {
                                        pcVar12 = (local_140->_M_dataplus)._M_p;
                                      }
                                      testing::internal::AssertHelper::AssertHelper
                                                (&local_178,kNonFatalFailure,
                                                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map_test_util.h"
                                                 ,0x127,pcVar12);
                                      testing::internal::AssertHelper::operator=
                                                (&local_178,(Message *)local_168);
                                      testing::internal::AssertHelper::~AssertHelper(&local_178);
                                      if (local_168 != (undefined1  [8])0x0) {
                                        (**(code **)(*(size_type *)local_168 + 8))();
                                      }
                                    }
                                    local_120 = &(message->field_0)._impl_.map_int32_enum_.
                                                 super_TypeDefinedMapFieldBase<int,_proto2_unittest::MapEnum>
                                                 .field_0;
                                    if (local_140 !=
                                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)0x0) {
                                      std::
                                      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_140,local_140);
                                    }
                                    local_148._0_4_ = 1;
                                    protobuf::internal::MapFieldBase::SyncMapWithRepeatedField
                                              ((MapFieldBase *)local_b0);
                                    local_178.data_._0_4_ = 0;
                                    pMVar10 = Map<int,_proto2_unittest::MapEnum>::at<int>
                                                        (&local_120->map_,(key_arg<int> *)&local_178
                                                        );
                                    testing::internal::
                                    CmpHelperEQ<proto2_unittest::MapEnum,proto2_unittest::MapEnum>
                                              ((internal *)local_168,"MapEnum_BAR<TestMap>()",
                                               "message.map_int32_enum().at(0)",(MapEnum *)local_148
                                               ,pMVar10);
                                    if (local_168[0] == (internal)0x0) {
                                      testing::Message::Message((Message *)local_148);
                                      if (local_160 ==
                                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)0x0) {
                                        pcVar12 = anon_var_dwarf_a12c75 + 5;
                                      }
                                      else {
                                        pcVar12 = (local_160->_M_dataplus)._M_p;
                                      }
                                      testing::internal::AssertHelper::AssertHelper
                                                (&local_178,kNonFatalFailure,
                                                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map_test_util.h"
                                                 ,0x128,pcVar12);
                                      testing::internal::AssertHelper::operator=
                                                (&local_178,(Message *)local_148);
                                      testing::internal::AssertHelper::~AssertHelper(&local_178);
                                      if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                                           )local_148 !=
                                          (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           )0x0) {
                                        (**(code **)(*(long *)local_148 + 8))();
                                      }
                                    }
                                    this_03 = &(message->field_0)._impl_.map_int32_foreign_message_.
                                               super_TypeDefinedMapFieldBase<int,_proto2_unittest::ForeignMessage>
                                               .field_0;
                                    if (local_160 !=
                                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)0x0) {
                                      std::
                                      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_160,local_160);
                                    }
                                    local_148 = (undefined1  [8])
                                                ((ulong)local_148 & 0xffffffff00000000);
                                    protobuf::internal::MapFieldBase::SyncMapWithRepeatedField
                                              ((MapFieldBase *)local_b8);
                                    local_124 = 0;
                                    pFVar11 = Map<int,_proto2_unittest::ForeignMessage>::at<int>
                                                        (&this_03->map_,&local_124);
                                    local_178.data_._0_4_ = (pFVar11->field_0)._impl_.c_;
                                    testing::internal::CmpHelperEQ<int,int>
                                              ((internal *)local_168,"0",
                                               "message.map_int32_foreign_message().at(0).c()",
                                               (int *)local_148,(int *)&local_178);
                                    if (local_168[0] == (internal)0x0) {
                                      testing::Message::Message((Message *)local_148);
                                      if (local_160 ==
                                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)0x0) {
                                        pcVar12 = anon_var_dwarf_a12c75 + 5;
                                      }
                                      else {
                                        pcVar12 = (local_160->_M_dataplus)._M_p;
                                      }
                                      testing::internal::AssertHelper::AssertHelper
                                                (&local_178,kNonFatalFailure,
                                                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map_test_util.h"
                                                 ,0x129,pcVar12);
                                      testing::internal::AssertHelper::operator=
                                                (&local_178,(Message *)local_148);
                                      testing::internal::AssertHelper::~AssertHelper(&local_178);
                                      if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                                           )local_148 !=
                                          (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           )0x0) {
                                        (**(code **)(*(long *)local_148 + 8))();
                                      }
                                    }
                                    if (local_160 !=
                                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)0x0) {
                                      std::
                                      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_160,local_160);
                                    }
                                    local_148._0_4_ = 1;
                                    protobuf::internal::MapFieldBase::SyncMapWithRepeatedField
                                              ((MapFieldBase *)&this->_impl_);
                                    local_178.data_._0_4_ = 1;
                                    piVar2 = Map<int,_int>::at<int>
                                                       (&local_38->map_,(key_arg<int> *)&local_178);
                                    testing::internal::CmpHelperEQ<int,int>
                                              ((internal *)local_168,"1",
                                               "message.map_int32_int32().at(1)",(int *)local_148,
                                               piVar2);
                                    if (local_168[0] == (internal)0x0) {
                                      testing::Message::Message((Message *)local_148);
                                      if (local_160 ==
                                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)0x0) {
                                        pcVar12 = anon_var_dwarf_a12c75 + 5;
                                      }
                                      else {
                                        pcVar12 = (local_160->_M_dataplus)._M_p;
                                      }
                                      testing::internal::AssertHelper::AssertHelper
                                                (&local_178,kNonFatalFailure,
                                                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map_test_util.h"
                                                 ,299,pcVar12);
                                      testing::internal::AssertHelper::operator=
                                                (&local_178,(Message *)local_148);
                                      testing::internal::AssertHelper::~AssertHelper(&local_178);
                                      if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                                           )local_148 !=
                                          (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           )0x0) {
                                        (**(code **)(*(long *)local_148 + 8))();
                                      }
                                    }
                                    if (local_160 !=
                                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)0x0) {
                                      std::
                                      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_160,local_160);
                                    }
                                    local_178.data_._0_4_ = 1;
                                    protobuf::internal::MapFieldBase::SyncMapWithRepeatedField
                                              ((MapFieldBase *)this_00);
                                    local_148 = (undefined1  [8])0x1;
                                    plVar3 = Map<long,_long>::at<long>
                                                       (&local_c0->map_,(key_arg<long> *)local_148);
                                    testing::internal::CmpHelperEQ<int,long>
                                              ((internal *)local_168,"1",
                                               "message.map_int64_int64().at(1)",(int *)&local_178,
                                               plVar3);
                                    if (local_168[0] == (internal)0x0) {
                                      testing::Message::Message((Message *)local_148);
                                      if (local_160 ==
                                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)0x0) {
                                        pcVar12 = anon_var_dwarf_a12c75 + 5;
                                      }
                                      else {
                                        pcVar12 = (local_160->_M_dataplus)._M_p;
                                      }
                                      testing::internal::AssertHelper::AssertHelper
                                                (&local_178,kNonFatalFailure,
                                                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map_test_util.h"
                                                 ,300,pcVar12);
                                      testing::internal::AssertHelper::operator=
                                                (&local_178,(Message *)local_148);
                                      testing::internal::AssertHelper::~AssertHelper(&local_178);
                                      if (local_148 != (undefined1  [8])0x0) {
                                        (**(code **)(*(long *)local_148 + 8))();
                                      }
                                    }
                                    if (local_160 !=
                                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)0x0) {
                                      std::
                                      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_160,local_160);
                                    }
                                    local_148._0_4_ = 1;
                                    protobuf::internal::MapFieldBase::SyncMapWithRepeatedField
                                              ((MapFieldBase *)this_01);
                                    local_178.data_._0_4_ = 1;
                                    puVar4 = Map<unsigned_int,_unsigned_int>::at<unsigned_int>
                                                       (&local_c8->map_,
                                                        (key_arg<unsigned_int> *)&local_178);
                                    testing::internal::CmpHelperEQ<int,unsigned_int>
                                              ((internal *)local_168,"1",
                                               "message.map_uint32_uint32().at(1)",(int *)local_148,
                                               puVar4);
                                    if (local_168[0] == (internal)0x0) {
                                      testing::Message::Message((Message *)local_148);
                                      if (local_160 ==
                                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)0x0) {
                                        pcVar12 = anon_var_dwarf_a12c75 + 5;
                                      }
                                      else {
                                        pcVar12 = (local_160->_M_dataplus)._M_p;
                                      }
                                      testing::internal::AssertHelper::AssertHelper
                                                (&local_178,kNonFatalFailure,
                                                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map_test_util.h"
                                                 ,0x12d,pcVar12);
                                      testing::internal::AssertHelper::operator=
                                                (&local_178,(Message *)local_148);
                                      testing::internal::AssertHelper::~AssertHelper(&local_178);
                                      if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                                           )local_148 !=
                                          (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           )0x0) {
                                        (**(code **)(*(long *)local_148 + 8))();
                                      }
                                    }
                                    if (local_160 !=
                                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)0x0) {
                                      std::
                                      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_160,local_160);
                                    }
                                    local_178.data_._0_4_ = 1;
                                    protobuf::internal::MapFieldBase::SyncMapWithRepeatedField
                                              ((MapFieldBase *)local_50);
                                    local_148 = (undefined1  [8])0x1;
                                    puVar5 = Map<unsigned_long,_unsigned_long>::at<unsigned_long>
                                                       (&local_d0->map_,
                                                        (key_arg<unsigned_long> *)local_148);
                                    testing::internal::CmpHelperEQ<int,unsigned_long>
                                              ((internal *)local_168,"1",
                                               "message.map_uint64_uint64().at(1)",(int *)&local_178
                                               ,puVar5);
                                    if (local_168[0] == (internal)0x0) {
                                      testing::Message::Message((Message *)local_148);
                                      if (local_160 ==
                                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)0x0) {
                                        pcVar12 = anon_var_dwarf_a12c75 + 5;
                                      }
                                      else {
                                        pcVar12 = (local_160->_M_dataplus)._M_p;
                                      }
                                      testing::internal::AssertHelper::AssertHelper
                                                (&local_178,kNonFatalFailure,
                                                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map_test_util.h"
                                                 ,0x12e,pcVar12);
                                      testing::internal::AssertHelper::operator=
                                                (&local_178,(Message *)local_148);
                                      testing::internal::AssertHelper::~AssertHelper(&local_178);
                                      if (local_148 != (undefined1  [8])0x0) {
                                        (**(code **)(*(long *)local_148 + 8))();
                                      }
                                    }
                                    if (local_160 !=
                                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)0x0) {
                                      std::
                                      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_160,local_160);
                                    }
                                    local_148._0_4_ = 1;
                                    protobuf::internal::MapFieldBase::SyncMapWithRepeatedField
                                              ((MapFieldBase *)local_58);
                                    local_178.data_._0_4_ = 1;
                                    piVar2 = Map<int,_int>::at<int>
                                                       (&local_d8->map_,(key_arg<int> *)&local_178);
                                    testing::internal::CmpHelperEQ<int,int>
                                              ((internal *)local_168,"1",
                                               "message.map_sint32_sint32().at(1)",(int *)local_148,
                                               piVar2);
                                    if (local_168[0] == (internal)0x0) {
                                      testing::Message::Message((Message *)local_148);
                                      if (local_160 ==
                                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)0x0) {
                                        pcVar12 = anon_var_dwarf_a12c75 + 5;
                                      }
                                      else {
                                        pcVar12 = (local_160->_M_dataplus)._M_p;
                                      }
                                      testing::internal::AssertHelper::AssertHelper
                                                (&local_178,kNonFatalFailure,
                                                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map_test_util.h"
                                                 ,0x12f,pcVar12);
                                      testing::internal::AssertHelper::operator=
                                                (&local_178,(Message *)local_148);
                                      testing::internal::AssertHelper::~AssertHelper(&local_178);
                                      if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                                           )local_148 !=
                                          (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           )0x0) {
                                        (**(code **)(*(long *)local_148 + 8))();
                                      }
                                    }
                                    if (local_160 !=
                                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)0x0) {
                                      std::
                                      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_160,local_160);
                                    }
                                    local_178.data_._0_4_ = 1;
                                    protobuf::internal::MapFieldBase::SyncMapWithRepeatedField
                                              ((MapFieldBase *)local_60);
                                    local_148 = (undefined1  [8])0x1;
                                    plVar3 = Map<long,_long>::at<long>
                                                       (&local_e0->map_,(key_arg<long> *)local_148);
                                    testing::internal::CmpHelperEQ<int,long>
                                              ((internal *)local_168,"1",
                                               "message.map_sint64_sint64().at(1)",(int *)&local_178
                                               ,plVar3);
                                    if (local_168[0] == (internal)0x0) {
                                      testing::Message::Message((Message *)local_148);
                                      if (local_160 ==
                                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)0x0) {
                                        pcVar12 = anon_var_dwarf_a12c75 + 5;
                                      }
                                      else {
                                        pcVar12 = (local_160->_M_dataplus)._M_p;
                                      }
                                      testing::internal::AssertHelper::AssertHelper
                                                (&local_178,kNonFatalFailure,
                                                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map_test_util.h"
                                                 ,0x130,pcVar12);
                                      testing::internal::AssertHelper::operator=
                                                (&local_178,(Message *)local_148);
                                      testing::internal::AssertHelper::~AssertHelper(&local_178);
                                      if (local_148 != (undefined1  [8])0x0) {
                                        (**(code **)(*(long *)local_148 + 8))();
                                      }
                                    }
                                    if (local_160 !=
                                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)0x0) {
                                      std::
                                      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_160,local_160);
                                    }
                                    local_148._0_4_ = 1;
                                    protobuf::internal::MapFieldBase::SyncMapWithRepeatedField
                                              ((MapFieldBase *)local_68);
                                    local_178.data_._0_4_ = 1;
                                    puVar4 = Map<unsigned_int,_unsigned_int>::at<unsigned_int>
                                                       (&local_e8->map_,
                                                        (key_arg<unsigned_int> *)&local_178);
                                    testing::internal::CmpHelperEQ<int,unsigned_int>
                                              ((internal *)local_168,"1",
                                               "message.map_fixed32_fixed32().at(1)",
                                               (int *)local_148,puVar4);
                                    if (local_168[0] == (internal)0x0) {
                                      testing::Message::Message((Message *)local_148);
                                      if (local_160 ==
                                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)0x0) {
                                        pcVar12 = anon_var_dwarf_a12c75 + 5;
                                      }
                                      else {
                                        pcVar12 = (local_160->_M_dataplus)._M_p;
                                      }
                                      testing::internal::AssertHelper::AssertHelper
                                                (&local_178,kNonFatalFailure,
                                                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map_test_util.h"
                                                 ,0x131,pcVar12);
                                      testing::internal::AssertHelper::operator=
                                                (&local_178,(Message *)local_148);
                                      testing::internal::AssertHelper::~AssertHelper(&local_178);
                                      if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                                           )local_148 !=
                                          (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           )0x0) {
                                        (**(code **)(*(long *)local_148 + 8))();
                                      }
                                    }
                                    if (local_160 !=
                                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)0x0) {
                                      std::
                                      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_160,local_160);
                                    }
                                    local_178.data_._0_4_ = 1;
                                    protobuf::internal::MapFieldBase::SyncMapWithRepeatedField
                                              ((MapFieldBase *)local_70);
                                    local_148 = (undefined1  [8])0x1;
                                    puVar5 = Map<unsigned_long,_unsigned_long>::at<unsigned_long>
                                                       (&local_f0->map_,
                                                        (key_arg<unsigned_long> *)local_148);
                                    testing::internal::CmpHelperEQ<int,unsigned_long>
                                              ((internal *)local_168,"1",
                                               "message.map_fixed64_fixed64().at(1)",
                                               (int *)&local_178,puVar5);
                                    if (local_168[0] == (internal)0x0) {
                                      testing::Message::Message((Message *)local_148);
                                      if (local_160 ==
                                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)0x0) {
                                        pcVar12 = anon_var_dwarf_a12c75 + 5;
                                      }
                                      else {
                                        pcVar12 = (local_160->_M_dataplus)._M_p;
                                      }
                                      testing::internal::AssertHelper::AssertHelper
                                                (&local_178,kNonFatalFailure,
                                                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map_test_util.h"
                                                 ,0x132,pcVar12);
                                      testing::internal::AssertHelper::operator=
                                                (&local_178,(Message *)local_148);
                                      testing::internal::AssertHelper::~AssertHelper(&local_178);
                                      if (local_148 != (undefined1  [8])0x0) {
                                        (**(code **)(*(long *)local_148 + 8))();
                                      }
                                    }
                                    if (local_160 !=
                                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)0x0) {
                                      std::
                                      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_160,local_160);
                                    }
                                    local_148._0_4_ = 1;
                                    protobuf::internal::MapFieldBase::SyncMapWithRepeatedField
                                              ((MapFieldBase *)local_78);
                                    local_178.data_._0_4_ = 1;
                                    piVar2 = Map<int,_int>::at<int>
                                                       (&local_f8->map_,(key_arg<int> *)&local_178);
                                    testing::internal::CmpHelperEQ<int,int>
                                              ((internal *)local_168,"1",
                                               "message.map_sfixed32_sfixed32().at(1)",
                                               (int *)local_148,piVar2);
                                    if (local_168[0] == (internal)0x0) {
                                      testing::Message::Message((Message *)local_148);
                                      if (local_160 ==
                                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)0x0) {
                                        pcVar12 = anon_var_dwarf_a12c75 + 5;
                                      }
                                      else {
                                        pcVar12 = (local_160->_M_dataplus)._M_p;
                                      }
                                      testing::internal::AssertHelper::AssertHelper
                                                (&local_178,kNonFatalFailure,
                                                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map_test_util.h"
                                                 ,0x133,pcVar12);
                                      testing::internal::AssertHelper::operator=
                                                (&local_178,(Message *)local_148);
                                      testing::internal::AssertHelper::~AssertHelper(&local_178);
                                      if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                                           )local_148 !=
                                          (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           )0x0) {
                                        (**(code **)(*(long *)local_148 + 8))();
                                      }
                                    }
                                    if (local_160 !=
                                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)0x0) {
                                      std::
                                      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_160,local_160);
                                    }
                                    local_178.data_._0_4_ = 1;
                                    protobuf::internal::MapFieldBase::SyncMapWithRepeatedField
                                              ((MapFieldBase *)local_80);
                                    local_148 = (undefined1  [8])0x1;
                                    plVar3 = Map<long,_long>::at<long>
                                                       (&local_100->map_,(key_arg<long> *)local_148)
                                    ;
                                    testing::internal::CmpHelperEQ<int,long>
                                              ((internal *)local_168,"1",
                                               "message.map_sfixed64_sfixed64().at(1)",
                                               (int *)&local_178,plVar3);
                                    if (local_168[0] == (internal)0x0) {
                                      testing::Message::Message((Message *)local_148);
                                      if (local_160 ==
                                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)0x0) {
                                        pcVar12 = anon_var_dwarf_a12c75 + 5;
                                      }
                                      else {
                                        pcVar12 = (local_160->_M_dataplus)._M_p;
                                      }
                                      testing::internal::AssertHelper::AssertHelper
                                                (&local_178,kNonFatalFailure,
                                                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map_test_util.h"
                                                 ,0x134,pcVar12);
                                      testing::internal::AssertHelper::operator=
                                                (&local_178,(Message *)local_148);
                                      testing::internal::AssertHelper::~AssertHelper(&local_178);
                                      if (local_148 != (undefined1  [8])0x0) {
                                        (**(code **)(*(long *)local_148 + 8))();
                                      }
                                    }
                                    if (local_160 !=
                                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)0x0) {
                                      std::
                                      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_160,local_160);
                                    }
                                    local_148._0_4_ = 1;
                                    protobuf::internal::MapFieldBase::SyncMapWithRepeatedField
                                              ((MapFieldBase *)local_88);
                                    local_178.data_._0_4_ = 1;
                                    pfVar6 = Map<int,_float>::at<int>
                                                       (&local_108->map_,(key_arg<int> *)&local_178)
                                    ;
                                    testing::internal::CmpHelperEQ<int,float>
                                              ((internal *)local_168,"1",
                                               "message.map_int32_float().at(1)",(int *)local_148,
                                               pfVar6);
                                    if (local_168[0] == (internal)0x0) {
                                      testing::Message::Message((Message *)local_148);
                                      if (local_160 ==
                                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)0x0) {
                                        pcVar12 = anon_var_dwarf_a12c75 + 5;
                                      }
                                      else {
                                        pcVar12 = (local_160->_M_dataplus)._M_p;
                                      }
                                      testing::internal::AssertHelper::AssertHelper
                                                (&local_178,kNonFatalFailure,
                                                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map_test_util.h"
                                                 ,0x135,pcVar12);
                                      testing::internal::AssertHelper::operator=
                                                (&local_178,(Message *)local_148);
                                      testing::internal::AssertHelper::~AssertHelper(&local_178);
                                      if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                                           )local_148 !=
                                          (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           )0x0) {
                                        (**(code **)(*(long *)local_148 + 8))();
                                      }
                                    }
                                    if (local_160 !=
                                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)0x0) {
                                      std::
                                      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_160,local_160);
                                    }
                                    local_148._0_4_ = 1;
                                    protobuf::internal::MapFieldBase::SyncMapWithRepeatedField
                                              ((MapFieldBase *)local_90);
                                    local_178.data_._0_4_ = 1;
                                    pdVar7 = Map<int,_double>::at<int>
                                                       (&local_110->map_,(key_arg<int> *)&local_178)
                                    ;
                                    testing::internal::CmpHelperEQ<int,double>
                                              ((internal *)local_168,"1",
                                               "message.map_int32_double().at(1)",(int *)local_148,
                                               pdVar7);
                                    if (local_168[0] == (internal)0x0) {
                                      testing::Message::Message((Message *)local_148);
                                      if (local_160 ==
                                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)0x0) {
                                        pcVar12 = anon_var_dwarf_a12c75 + 5;
                                      }
                                      else {
                                        pcVar12 = (local_160->_M_dataplus)._M_p;
                                      }
                                      testing::internal::AssertHelper::AssertHelper
                                                (&local_178,kNonFatalFailure,
                                                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map_test_util.h"
                                                 ,0x136,pcVar12);
                                      testing::internal::AssertHelper::operator=
                                                (&local_178,(Message *)local_148);
                                      testing::internal::AssertHelper::~AssertHelper(&local_178);
                                      if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                                           )local_148 !=
                                          (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           )0x0) {
                                        (**(code **)(*(long *)local_148 + 8))();
                                      }
                                    }
                                    if (local_160 !=
                                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)0x0) {
                                      std::
                                      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_160,local_160);
                                    }
                                    local_148[0] = (string)0x1;
                                    protobuf::internal::MapFieldBase::SyncMapWithRepeatedField
                                              ((MapFieldBase *)local_98);
                                    local_178.data_._0_4_ = CONCAT31(local_178.data_._1_3_,1);
                                    pbVar8 = Map<bool,_bool>::at<bool>
                                                       (&local_118->map_,(key_arg<bool> *)&local_178
                                                       );
                                    testing::internal::CmpHelperEQ<bool,bool>
                                              ((internal *)local_168,"true",
                                               "message.map_bool_bool().at(1)",(bool *)local_148,
                                               pbVar8);
                                    if (local_168[0] == (internal)0x0) {
                                      testing::Message::Message((Message *)local_148);
                                      if (local_160 ==
                                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)0x0) {
                                        pcVar12 = anon_var_dwarf_a12c75 + 5;
                                      }
                                      else {
                                        pcVar12 = (local_160->_M_dataplus)._M_p;
                                      }
                                      testing::internal::AssertHelper::AssertHelper
                                                (&local_178,kNonFatalFailure,
                                                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map_test_util.h"
                                                 ,0x137,pcVar12);
                                      testing::internal::AssertHelper::operator=
                                                (&local_178,(Message *)local_148);
                                      testing::internal::AssertHelper::~AssertHelper(&local_178);
                                      if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                                           )local_148 !=
                                          (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           )0x0) {
                                        (**(code **)(*(long *)local_148 + 8))();
                                      }
                                    }
                                    if (local_160 !=
                                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)0x0) {
                                      std::
                                      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_160,local_160);
                                    }
                                    local_168 = (undefined1  [8])&local_158;
                                    std::__cxx11::string::_M_construct<char_const*>
                                              ((string *)local_168,
                                               "This is another very long string that goes in the heap"
                                               ,"");
                                    protobuf::internal::MapFieldBase::SyncMapWithRepeatedField
                                              ((MapFieldBase *)local_a0);
                                    local_148 = (undefined1  [8])&local_138;
                                    std::__cxx11::string::_M_construct<char_const*>
                                              ((string *)local_148,
                                               "This is another very long string that goes in the heap"
                                               ,"");
                                    pbVar9 = Map<std::__cxx11::string,std::__cxx11::string>::
                                             at<std::__cxx11::string>
                                                       (local_40,(
                                                  key_arg<std::__cxx11::basic_string<char>_> *)
                                                  local_148);
                                    testing::internal::
                                    CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
                                              ((internal *)&local_178,"long_string_2()",
                                               "message.map_string_string().at(long_string_2())",
                                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                *)local_168,pbVar9);
                                    if (local_148 != (undefined1  [8])&local_138) {
                                      operator_delete((void *)local_148,
                                                      local_138._M_allocated_capacity + 1);
                                    }
                                    if (local_168 != (undefined1  [8])&local_158) {
                                      operator_delete((void *)local_168,
                                                      local_158._M_allocated_capacity + 1);
                                    }
                                    if (local_178.data_._0_1_ == (internal)0x0) {
                                      testing::Message::Message((Message *)local_168);
                                      if (local_170 ==
                                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)0x0) {
                                        pcVar12 = anon_var_dwarf_a12c75 + 5;
                                      }
                                      else {
                                        pcVar12 = (local_170->_M_dataplus)._M_p;
                                      }
                                      testing::internal::AssertHelper::AssertHelper
                                                ((AssertHelper *)local_148,kNonFatalFailure,
                                                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map_test_util.h"
                                                 ,0x138,pcVar12);
                                      testing::internal::AssertHelper::operator=
                                                ((AssertHelper *)local_148,(Message *)local_168);
                                      testing::internal::AssertHelper::~AssertHelper
                                                ((AssertHelper *)local_148);
                                      if (local_168 != (undefined1  [8])0x0) {
                                        (**(code **)(*(size_type *)local_168 + 8))();
                                      }
                                    }
                                    if (local_170 !=
                                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)0x0) {
                                      std::
                                      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_170,local_170);
                                    }
                                    local_168 = (undefined1  [8])&local_158;
                                    std::__cxx11::string::_M_construct<char_const*>
                                              ((string *)local_168,
                                               "This is another very long string that goes in the heap"
                                               ,"");
                                    protobuf::internal::MapFieldBase::SyncMapWithRepeatedField
                                              ((MapFieldBase *)local_a8);
                                    local_178.data_._0_4_ = 1;
                                    pbVar9 = Map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                             ::at<int>(&local_48->map_,(key_arg<int> *)&local_178);
                                    testing::internal::
                                    CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
                                              ((internal *)local_148,"long_string_2()",
                                               "message.map_int32_bytes().at(1)",
                                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                *)local_168,pbVar9);
                                    if (local_168 != (undefined1  [8])&local_158) {
                                      operator_delete((void *)local_168,
                                                      local_158._M_allocated_capacity + 1);
                                    }
                                    if (local_148[0] == (string)0x0) {
                                      testing::Message::Message((Message *)local_168);
                                      if (local_140 ==
                                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)0x0) {
                                        pcVar12 = anon_var_dwarf_a12c75 + 5;
                                      }
                                      else {
                                        pcVar12 = (local_140->_M_dataplus)._M_p;
                                      }
                                      testing::internal::AssertHelper::AssertHelper
                                                (&local_178,kNonFatalFailure,
                                                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map_test_util.h"
                                                 ,0x139,pcVar12);
                                      testing::internal::AssertHelper::operator=
                                                (&local_178,(Message *)local_168);
                                      testing::internal::AssertHelper::~AssertHelper(&local_178);
                                      if (local_168 != (undefined1  [8])0x0) {
                                        (**(code **)(*(size_type *)local_168 + 8))();
                                      }
                                    }
                                    if (local_140 !=
                                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)0x0) {
                                      std::
                                      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_140,local_140);
                                    }
                                    local_148._0_4_ = 2;
                                    protobuf::internal::MapFieldBase::SyncMapWithRepeatedField
                                              ((MapFieldBase *)local_b0);
                                    local_178.data_._0_4_ = 1;
                                    pMVar10 = Map<int,_proto2_unittest::MapEnum>::at<int>
                                                        (&local_120->map_,(key_arg<int> *)&local_178
                                                        );
                                    testing::internal::
                                    CmpHelperEQ<proto2_unittest::MapEnum,proto2_unittest::MapEnum>
                                              ((internal *)local_168,"MapEnum_BAZ<TestMap>()",
                                               "message.map_int32_enum().at(1)",(MapEnum *)local_148
                                               ,pMVar10);
                                    if (local_168[0] == (internal)0x0) {
                                      testing::Message::Message((Message *)local_148);
                                      if (local_160 ==
                                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)0x0) {
                                        pcVar12 = anon_var_dwarf_a12c75 + 5;
                                      }
                                      else {
                                        pcVar12 = (local_160->_M_dataplus)._M_p;
                                      }
                                      testing::internal::AssertHelper::AssertHelper
                                                (&local_178,kNonFatalFailure,
                                                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map_test_util.h"
                                                 ,0x13a,pcVar12);
                                      testing::internal::AssertHelper::operator=
                                                (&local_178,(Message *)local_148);
                                      testing::internal::AssertHelper::~AssertHelper(&local_178);
                                      if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                                           )local_148 !=
                                          (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           )0x0) {
                                        (**(code **)(*(long *)local_148 + 8))();
                                      }
                                    }
                                    if (local_160 !=
                                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)0x0) {
                                      std::
                                      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_160,local_160);
                                    }
                                    local_148._0_4_ = 1;
                                    protobuf::internal::MapFieldBase::SyncMapWithRepeatedField
                                              ((MapFieldBase *)local_b8);
                                    local_124 = 1;
                                    pFVar11 = Map<int,_proto2_unittest::ForeignMessage>::at<int>
                                                        (&this_03->map_,&local_124);
                                    local_178.data_._0_4_ = (pFVar11->field_0)._impl_.c_;
                                    testing::internal::CmpHelperEQ<int,int>
                                              ((internal *)local_168,"1",
                                               "message.map_int32_foreign_message().at(1).c()",
                                               (int *)local_148,(int *)&local_178);
                                    if (local_168[0] == (internal)0x0) {
                                      testing::Message::Message((Message *)local_148);
                                      if (local_160 ==
                                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)0x0) {
                                        pcVar12 = anon_var_dwarf_a12c75 + 5;
                                      }
                                      else {
                                        pcVar12 = (local_160->_M_dataplus)._M_p;
                                      }
                                      testing::internal::AssertHelper::AssertHelper
                                                (&local_178,kNonFatalFailure,
                                                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map_test_util.h"
                                                 ,0x13b,pcVar12);
                                      testing::internal::AssertHelper::operator=
                                                (&local_178,(Message *)local_148);
                                      testing::internal::AssertHelper::~AssertHelper(&local_178);
                                      if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                                           )local_148 !=
                                          (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           )0x0) {
                                        (**(code **)(*(long *)local_148 + 8))();
                                      }
                                    }
                                    if (local_160 !=
                                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)0x0) {
                                      std::
                                      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_160,local_160);
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void MapTestUtil::ExpectMapFieldsSet(const TestMap& message) {
  ASSERT_EQ(2, message.map_int32_int32().size());
  ASSERT_EQ(2, message.map_int64_int64().size());
  ASSERT_EQ(2, message.map_uint32_uint32().size());
  ASSERT_EQ(2, message.map_uint64_uint64().size());
  ASSERT_EQ(2, message.map_sint32_sint32().size());
  ASSERT_EQ(2, message.map_sint64_sint64().size());
  ASSERT_EQ(2, message.map_fixed32_fixed32().size());
  ASSERT_EQ(2, message.map_fixed64_fixed64().size());
  ASSERT_EQ(2, message.map_sfixed32_sfixed32().size());
  ASSERT_EQ(2, message.map_sfixed64_sfixed64().size());
  ASSERT_EQ(2, message.map_int32_float().size());
  ASSERT_EQ(2, message.map_int32_double().size());
  ASSERT_EQ(2, message.map_bool_bool().size());
  ASSERT_EQ(2, message.map_string_string().size());
  ASSERT_EQ(2, message.map_int32_bytes().size());
  ASSERT_EQ(2, message.map_int32_enum().size());
  ASSERT_EQ(2, message.map_int32_foreign_message().size());

  EXPECT_EQ(0, message.map_int32_int32().at(0));
  EXPECT_EQ(0, message.map_int64_int64().at(0));
  EXPECT_EQ(0, message.map_uint32_uint32().at(0));
  EXPECT_EQ(0, message.map_uint64_uint64().at(0));
  EXPECT_EQ(0, message.map_sint32_sint32().at(0));
  EXPECT_EQ(0, message.map_sint64_sint64().at(0));
  EXPECT_EQ(0, message.map_fixed32_fixed32().at(0));
  EXPECT_EQ(0, message.map_fixed64_fixed64().at(0));
  EXPECT_EQ(0, message.map_sfixed32_sfixed32().at(0));
  EXPECT_EQ(0, message.map_sfixed64_sfixed64().at(0));
  EXPECT_EQ(0, message.map_int32_float().at(0));
  EXPECT_EQ(0, message.map_int32_double().at(0));
  EXPECT_EQ(false, message.map_bool_bool().at(0));
  EXPECT_EQ(long_string(), message.map_string_string().at(long_string()));
  EXPECT_EQ(long_string(), message.map_int32_bytes().at(0));
  EXPECT_EQ(MapEnum_BAR<TestMap>(), message.map_int32_enum().at(0));
  EXPECT_EQ(0, message.map_int32_foreign_message().at(0).c());

  EXPECT_EQ(1, message.map_int32_int32().at(1));
  EXPECT_EQ(1, message.map_int64_int64().at(1));
  EXPECT_EQ(1, message.map_uint32_uint32().at(1));
  EXPECT_EQ(1, message.map_uint64_uint64().at(1));
  EXPECT_EQ(1, message.map_sint32_sint32().at(1));
  EXPECT_EQ(1, message.map_sint64_sint64().at(1));
  EXPECT_EQ(1, message.map_fixed32_fixed32().at(1));
  EXPECT_EQ(1, message.map_fixed64_fixed64().at(1));
  EXPECT_EQ(1, message.map_sfixed32_sfixed32().at(1));
  EXPECT_EQ(1, message.map_sfixed64_sfixed64().at(1));
  EXPECT_EQ(1, message.map_int32_float().at(1));
  EXPECT_EQ(1, message.map_int32_double().at(1));
  EXPECT_EQ(true, message.map_bool_bool().at(1));
  EXPECT_EQ(long_string_2(), message.map_string_string().at(long_string_2()));
  EXPECT_EQ(long_string_2(), message.map_int32_bytes().at(1));
  EXPECT_EQ(MapEnum_BAZ<TestMap>(), message.map_int32_enum().at(1));
  EXPECT_EQ(1, message.map_int32_foreign_message().at(1).c());
}